

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.c
# Opt level: O3

int uv_spawn(uv_loop_t *loop,uv_process_t *process,uv_process_options_t *options)

{
  void **ppvVar1;
  uint *puVar2;
  uv_stdio_container_t *puVar3;
  long lVar4;
  uv_loop_t *puVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  int (*pipes) [2];
  long *plVar9;
  ssize_t sVar10;
  int *piVar11;
  long lVar12;
  uv_process_t *puVar13;
  ulong uVar14;
  int (*fds) [2];
  uv_rwlock_t *rwlock;
  ulong uVar15;
  long lVar16;
  int signal_pipe [2];
  int status;
  int exec_errorno;
  int pipes_storage [8] [2];
  undefined8 local_a8;
  uint local_9c;
  int local_98;
  int local_94;
  uv_process_t *local_90;
  uv_loop_t *local_88;
  void **local_80;
  int local_78 [18];
  
  local_a8 = 0xffffffffffffffff;
  if ((options->cpumask != (char *)0x0) &&
     (uVar14 = options->cpumask_size, iVar6 = uv_cpumask_size(), uVar14 < (ulong)(long)iVar6)) {
    return -0x16;
  }
  if (options->file == (char *)0x0) {
    __assert_fail("options->file != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmlibuv/src/unix/process.c"
                  ,0x1e4,"int uv_spawn(uv_loop_t *, uv_process_t *, const uv_process_options_t *)");
  }
  if (0x1f < options->flags) {
    __assert_fail("!(options->flags & ~(UV_PROCESS_DETACHED | UV_PROCESS_SETGID | UV_PROCESS_SETUID | UV_PROCESS_WINDOWS_HIDE | UV_PROCESS_WINDOWS_VERBATIM_ARGUMENTS))"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmlibuv/src/unix/process.c"
                  ,0x1e9,"int uv_spawn(uv_loop_t *, uv_process_t *, const uv_process_options_t *)");
  }
  process->loop = loop;
  process->type = UV_PROCESS;
  process->flags = 8;
  process->handle_queue[0] = loop->handle_queue;
  plVar9 = (long *)loop->handle_queue[1];
  process->handle_queue[1] = plVar9;
  *plVar9 = (long)process->handle_queue;
  loop->handle_queue[1] = process->handle_queue;
  process->next_closing = (uv_handle_t *)0x0;
  ppvVar1 = process->queue;
  process->queue[0] = ppvVar1;
  process->queue[1] = ppvVar1;
  uVar7 = options->stdio_count;
  local_9c = 3;
  if (3 < (int)uVar7) {
    local_9c = uVar7;
  }
  uVar14 = (ulong)local_9c;
  if ((int)uVar7 < 9) {
    pipes = (int (*) [2])local_78;
  }
  else {
    pipes = (int (*) [2])uv__malloc(uVar14 * 8);
    if (pipes == (int (*) [2])0x0) {
      return -0xc;
    }
  }
  local_90 = process;
  local_88 = loop;
  local_80 = ppvVar1;
  memset(pipes,0xff,uVar14 * 8);
  if (0 < options->stdio_count) {
    lVar12 = 8;
    lVar16 = 0;
    fds = pipes;
    do {
      puVar3 = options->stdio;
      uVar7 = *(uint *)((long)puVar3 + lVar12 + -8);
      switch(uVar7 & 7) {
      case 0:
        break;
      case 1:
        lVar4 = *(long *)((long)&puVar3->flags + lVar12);
        if (lVar4 == 0) {
          __assert_fail("container->data.stream != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmlibuv/src/unix/process.c"
                        ,0xd2,"int uv__process_init_stdio(uv_stdio_container_t *, int *)");
        }
        if (*(int *)(lVar4 + 0x10) != 7) {
LAB_0048acdf:
          iVar6 = -0x16;
          goto LAB_0048ad0e;
        }
        iVar6 = uv__make_socketpair(*fds,0);
        if (iVar6 != 0) goto LAB_0048ad0e;
        break;
      case 2:
      case 4:
        plVar9 = (long *)((long)&puVar3->flags + lVar12);
        if ((uVar7 & 2) == 0) {
          plVar9 = (long *)(*plVar9 + 0xb8);
        }
        if ((int)*plVar9 == -1) goto LAB_0048acdf;
        (*fds)[1] = (int)*plVar9;
        break;
      default:
        __assert_fail("0 && \"Unexpected flags\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmlibuv/src/unix/process.c"
                      ,0xe6,"int uv__process_init_stdio(uv_stdio_container_t *, int *)");
      }
      lVar16 = lVar16 + 1;
      fds = fds + 1;
      lVar12 = lVar12 + 0x10;
    } while (lVar16 < options->stdio_count);
  }
  iVar6 = uv__make_pipe((int *)&local_a8,0);
  puVar5 = local_88;
  if (iVar6 == 0) {
    uv_signal_start(&local_88->child_watcher,uv__chld,0x11);
    rwlock = &puVar5->cloexec_lock;
    uv_rwlock_wrlock(rwlock);
    uVar7 = fork();
    if (uVar7 != 0xffffffff) {
      if (uVar7 == 0) {
        uv__process_child_init(options,local_9c,pipes,local_a8._4_4_);
        goto LAB_0048af8c;
      }
      uv_rwlock_wrunlock(rwlock);
      uv__close(local_a8._4_4_);
      puVar13 = local_90;
      local_90->status = 0;
      local_94 = 0;
      do {
        sVar10 = read((int)local_a8,&local_94,4);
        if (sVar10 != -1) {
          if (sVar10 == 0) goto LAB_0048adb6;
          if (sVar10 != 4) goto LAB_0048aef8;
          goto LAB_0048ad8a;
        }
        piVar11 = __errno_location();
      } while (*piVar11 == 4);
      if (*piVar11 != 0x20) {
LAB_0048aef8:
        abort();
      }
      do {
        uVar8 = waitpid(uVar7,&local_98,0);
        if (uVar8 != 0xffffffff) break;
      } while (*piVar11 == 4);
      if (uVar8 != uVar7) {
        __assert_fail("err == pid",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmlibuv/src/unix/process.c"
                      ,0x245,
                      "int uv_spawn(uv_loop_t *, uv_process_t *, const uv_process_options_t *)");
      }
      goto LAB_0048adb6;
    }
    piVar11 = __errno_location();
    iVar6 = -*piVar11;
    uv_rwlock_wrunlock(rwlock);
    uv__close((int)local_a8);
    uv__close(local_a8._4_4_);
  }
LAB_0048ad0e:
  uVar15 = 0;
  do {
    if (((long)options->stdio_count <= (long)uVar15) ||
       ((options->stdio[uVar15].flags & (UV_INHERIT_STREAM|UV_INHERIT_FD)) == UV_IGNORE)) {
      if (pipes[uVar15][0] != -1) {
        uv__close_nocheckstdio(pipes[uVar15][0]);
      }
      if (pipes[uVar15][1] != -1) {
        uv__close_nocheckstdio(pipes[uVar15][1]);
      }
    }
    uVar15 = uVar15 + 1;
  } while (uVar15 != uVar14);
joined_r0x0048aeb0:
  if (pipes != (int (*) [2])local_78) {
    uv__free(pipes);
  }
  return iVar6;
  while (piVar11 = __errno_location(), *piVar11 == 4) {
LAB_0048ad8a:
    uVar8 = waitpid(uVar7,&local_98,0);
    if (uVar8 != 0xffffffff) break;
  }
  puVar13 = local_90;
  if (uVar8 != uVar7) {
LAB_0048af8c:
    __assert_fail("err == pid",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmlibuv/src/unix/process.c"
                  ,0x240,"int uv_spawn(uv_loop_t *, uv_process_t *, const uv_process_options_t *)");
  }
LAB_0048adb6:
  local_9c = uVar7;
  uv__close_nocheckstdio((int)local_a8);
  iVar6 = options->stdio_count;
  if (0 < iVar6) {
    lVar12 = 0;
    lVar16 = 0;
    do {
      puVar3 = options->stdio;
      if (((*(byte *)((long)&puVar3->flags + lVar12) & 1) != 0) && (-1 < pipes[lVar16][0])) {
        iVar6 = uv__close(pipes[lVar16][1]);
        if (iVar6 != 0) goto LAB_0048aef8;
        pipes[lVar16][1] = -1;
        uv__nonblock_ioctl(pipes[lVar16][0],1);
        uVar7 = *(uint *)((long)&puVar3->flags + lVar12);
        iVar6 = uv__stream_open(*(uv_stream_t **)((long)&puVar3->data + lVar12),pipes[lVar16][0],
                                (uVar7 & 0x10) << 0xb | (uVar7 & 0x20) << 9);
        if (iVar6 != 0) goto joined_r0x0048aecc;
        iVar6 = options->stdio_count;
      }
      lVar16 = lVar16 + 1;
      lVar12 = lVar12 + 0x10;
    } while (lVar16 < iVar6);
  }
  if (local_94 == 0) {
    puVar13->queue[0] = local_88->process_handles;
    plVar9 = (long *)local_88->process_handles[1];
    puVar13->queue[1] = plVar9;
    *plVar9 = (long)local_80;
    local_88->process_handles[1] = local_80;
    uVar7 = puVar13->flags;
    if (((uVar7 & 4) == 0) && (puVar13->flags = uVar7 | 4, (uVar7 & 8) != 0)) {
      puVar2 = &puVar13->loop->active_handles;
      *puVar2 = *puVar2 + 1;
    }
  }
  puVar13->pid = local_9c;
  puVar13->exit_cb = options->exit_cb;
  iVar6 = local_94;
  goto joined_r0x0048aeb0;
joined_r0x0048aecc:
  for (; lVar12 != 0; lVar12 = lVar12 + -0x10) {
    if ((*(byte *)((long)&options->stdio[-1].flags + lVar12) & 1) != 0) {
      uv__stream_close(*(uv_stream_t **)((long)options->stdio + lVar12 + -8));
    }
  }
  goto LAB_0048ad0e;
}

Assistant:

int uv_spawn(uv_loop_t* loop,
             uv_process_t* process,
             const uv_process_options_t* options) {
#if defined(__APPLE__) && (TARGET_OS_TV || TARGET_OS_WATCH)
  /* fork is marked __WATCHOS_PROHIBITED __TVOS_PROHIBITED. */
  return UV_ENOSYS;
#else
  int signal_pipe[2] = { -1, -1 };
  int pipes_storage[8][2];
  int (*pipes)[2];
  int stdio_count;
  ssize_t r;
  pid_t pid;
  int err;
  int exec_errorno;
  int i;
  int status;

  if (options->cpumask != NULL) {
#ifndef CMAKE_BOOTSTRAP
#if defined(__linux__) || defined(__FreeBSD__)
    if (options->cpumask_size < (size_t)uv_cpumask_size()) {
      return UV_EINVAL;
    }
#else
    return UV_ENOTSUP;
#endif
#else
    return UV_ENOTSUP;
#endif
  }

  assert(options->file != NULL);
  assert(!(options->flags & ~(UV_PROCESS_DETACHED |
                              UV_PROCESS_SETGID |
                              UV_PROCESS_SETUID |
                              UV_PROCESS_WINDOWS_HIDE |
                              UV_PROCESS_WINDOWS_VERBATIM_ARGUMENTS)));

  uv__handle_init(loop, (uv_handle_t*)process, UV_PROCESS);
  QUEUE_INIT(&process->queue);

  stdio_count = options->stdio_count;
  if (stdio_count < 3)
    stdio_count = 3;

  err = UV_ENOMEM;
  pipes = pipes_storage;
  if (stdio_count > (int) ARRAY_SIZE(pipes_storage))
    pipes = uv__malloc(stdio_count * sizeof(*pipes));

  if (pipes == NULL)
    goto error;

  for (i = 0; i < stdio_count; i++) {
    pipes[i][0] = -1;
    pipes[i][1] = -1;
  }

  for (i = 0; i < options->stdio_count; i++) {
    err = uv__process_init_stdio(options->stdio + i, pipes[i]);
    if (err)
      goto error;
  }

  /* This pipe is used by the parent to wait until
   * the child has called `execve()`. We need this
   * to avoid the following race condition:
   *
   *    if ((pid = fork()) > 0) {
   *      kill(pid, SIGTERM);
   *    }
   *    else if (pid == 0) {
   *      execve("/bin/cat", argp, envp);
   *    }
   *
   * The parent sends a signal immediately after forking.
   * Since the child may not have called `execve()` yet,
   * there is no telling what process receives the signal,
   * our fork or /bin/cat.
   *
   * To avoid ambiguity, we create a pipe with both ends
   * marked close-on-exec. Then, after the call to `fork()`,
   * the parent polls the read end until it EOFs or errors with EPIPE.
   */
  err = uv__make_pipe(signal_pipe, 0);
  if (err)
    goto error;

  uv_signal_start(&loop->child_watcher, uv__chld, SIGCHLD);

  /* Acquire write lock to prevent opening new fds in worker threads */
  uv_rwlock_wrlock(&loop->cloexec_lock);
  pid = fork();

  if (pid == -1) {
    err = UV__ERR(errno);
    uv_rwlock_wrunlock(&loop->cloexec_lock);
    uv__close(signal_pipe[0]);
    uv__close(signal_pipe[1]);
    goto error;
  }

  if (pid == 0) {
    uv__process_child_init(options, stdio_count, pipes, signal_pipe[1]);
    abort();
  }

  /* Release lock in parent process */
  uv_rwlock_wrunlock(&loop->cloexec_lock);
  uv__close(signal_pipe[1]);

  process->status = 0;
  exec_errorno = 0;
  do
    r = read(signal_pipe[0], &exec_errorno, sizeof(exec_errorno));
  while (r == -1 && errno == EINTR);

  if (r == 0)
    ; /* okay, EOF */
  else if (r == sizeof(exec_errorno)) {
    do
      err = waitpid(pid, &status, 0); /* okay, read errorno */
    while (err == -1 && errno == EINTR);
    assert(err == pid);
  } else if (r == -1 && errno == EPIPE) {
    do
      err = waitpid(pid, &status, 0); /* okay, got EPIPE */
    while (err == -1 && errno == EINTR);
    assert(err == pid);
  } else
    abort();

  uv__close_nocheckstdio(signal_pipe[0]);

  for (i = 0; i < options->stdio_count; i++) {
    err = uv__process_open_stream(options->stdio + i, pipes[i]);
    if (err == 0)
      continue;

    while (i--)
      uv__process_close_stream(options->stdio + i);

    goto error;
  }

  /* Only activate this handle if exec() happened successfully */
  if (exec_errorno == 0) {
    QUEUE_INSERT_TAIL(&loop->process_handles, &process->queue);
    uv__handle_start(process);
  }

  process->pid = pid;
  process->exit_cb = options->exit_cb;

  if (pipes != pipes_storage)
    uv__free(pipes);

  return exec_errorno;

error:
  if (pipes != NULL) {
    for (i = 0; i < stdio_count; i++) {
      if (i < options->stdio_count)
        if (options->stdio[i].flags & (UV_INHERIT_FD | UV_INHERIT_STREAM))
          continue;
      if (pipes[i][0] != -1)
        uv__close_nocheckstdio(pipes[i][0]);
      if (pipes[i][1] != -1)
        uv__close_nocheckstdio(pipes[i][1]);
    }

    if (pipes != pipes_storage)
      uv__free(pipes);
  }

  return err;
#endif
}